

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::dumpCaptureReplayKernelSource(CLIntercept *this,string *dumpDirectory,cl_kernel kernel)

{
  cl_int cVar1;
  size_t sVar2;
  size_t device;
  ulong uVar3;
  long lVar4;
  CLIntercept *__val;
  cl_uint num_devices;
  cl_program program;
  CLIntercept *local_360;
  long local_358;
  size_t size;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> binariesData;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  binaries;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sizes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> devices;
  string sourceCode;
  string local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  ofstream output;
  
  program = (cl_program)0x0;
  local_358 = 8;
  (*(this->m_Dispatch).clGetKernelInfo)(kernel,0x1194,8,&program,(size_t *)0x0);
  size = 0;
  (*(this->m_Dispatch).clGetProgramInfo)(program,0x1164,0,(void *)0x0,&size);
  sourceCode._M_dataplus._M_p = (pointer)&sourceCode.field_2;
  std::__cxx11::string::_M_construct((ulong)&sourceCode,(char)size);
  cVar1 = (*(this->m_Dispatch).clGetProgramInfo)
                    (program,0x1164,size,sourceCode._M_dataplus._M_p,(size_t *)0x0);
  if ((cVar1 == 0) && (1 < size)) {
    std::operator+(&local_2e8,dumpDirectory,"kernel.cl");
    std::ofstream::ofstream(&output,(string *)&local_2e8,_S_out|_S_bin);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::ostream::write((char *)&output,(long)sourceCode._M_dataplus._M_p);
    std::ofstream::~ofstream(&output);
  }
  else {
    num_devices = 0;
    (*(this->m_Dispatch).clGetProgramInfo)(program,0x1162,4,&num_devices,(size_t *)0x0);
    std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::vector
              (&devices,(ulong)num_devices,(allocator_type *)&output);
    (*(this->m_Dispatch).clGetProgramInfo)
              (program,0x1163,(ulong)num_devices << 3,
               devices.super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>._M_impl
               .super__Vector_impl_data._M_start,(size_t *)0x0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&sizes,(ulong)num_devices,(allocator_type *)&output);
    (*(this->m_Dispatch).clGetProgramInfo)
              (program,0x1165,(ulong)num_devices << 3,
               sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,(size_t *)0x0);
    binaries.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    binaries.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    binaries.
    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    binariesData.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    binariesData.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    binariesData.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_360 = this;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::reserve(&binaries,(ulong)num_devices);
    std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::reserve
              (&binariesData,(ulong)num_devices);
    lVar4 = 0;
    sVar2 = 0;
    for (uVar3 = 0; uVar3 != num_devices; uVar3 = uVar3 + 1) {
      std::
      vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
      ::emplace_back<unsigned_long&>
                ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  *)&binaries,
                 (unsigned_long *)
                 ((long)sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start + sVar2));
      _output = *(undefined8 *)
                 ((long)&((binaries.
                           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar4);
      std::vector<unsigned_char*,std::allocator<unsigned_char*>>::emplace_back<unsigned_char*>
                ((vector<unsigned_char*,std::allocator<unsigned_char*>> *)&binariesData,
                 (uchar **)&output);
      sVar2 = sVar2 + 8;
      lVar4 = lVar4 + 0x18;
    }
    cVar1 = (*(local_360->m_Dispatch).clGetProgramInfo)
                      (program,0x1166,sVar2,
                       binariesData.
                       super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl
                       .super__Vector_impl_data._M_start,(size_t *)0x0);
    if (cVar1 == 0) {
      __val = (CLIntercept *)0x0;
      while (__val != (CLIntercept *)(ulong)num_devices) {
        std::operator+(&local_270,dumpDirectory,"DeviceBinary");
        local_360 = __val;
        std::__cxx11::to_string(&local_290,(unsigned_long)__val);
        std::operator+(&local_250,&local_270,&local_290);
        std::operator+(&local_2e8,&local_250,".bin");
        std::ofstream::ofstream(&output,(string *)&local_2e8,_S_out|_S_bin);
        std::__cxx11::string::~string((string *)&local_2e8);
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::~string((string *)&local_290);
        std::__cxx11::string::~string((string *)&local_270);
        lVar4 = local_358;
        std::ostream::write((char *)&output,
                            *(long *)((long)binaries.
                                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start +
                                     local_358 + -8));
        std::ofstream::~ofstream(&output);
        local_358 = lVar4 + 0x18;
        __val = (CLIntercept *)((long)&local_360->m_ProcessId + 1);
      }
    }
    std::_Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>::~_Vector_base
              (&binariesData.super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~vector(&binaries);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::~_Vector_base
              (&devices.super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>);
  }
  std::__cxx11::string::~string((string *)&sourceCode);
  return;
}

Assistant:

void CLIntercept::dumpCaptureReplayKernelSource(
    const std::string& dumpDirectory,
    cl_kernel kernel )
{
    cl_program program = nullptr;
    dispatch().clGetKernelInfo(kernel, CL_KERNEL_PROGRAM, sizeof(cl_program), &program, nullptr);

    size_t size = 0;
    dispatch().clGetProgramInfo(program, CL_PROGRAM_SOURCE, 0, nullptr, &size);

    std::string sourceCode(size, ' ');
    int error = dispatch().clGetProgramInfo(program, CL_PROGRAM_SOURCE, size, &sourceCode[0], nullptr);
    if( error == CL_SUCCESS && size > 1 )
    {
        std::ofstream output(dumpDirectory + "kernel.cl", std::ios::out | std::ios::binary);
        output.write(sourceCode.c_str(), size);
    }
    else
    {
        cl_uint num_devices = 0;
        dispatch().clGetProgramInfo(program, CL_PROGRAM_NUM_DEVICES, sizeof(cl_uint), &num_devices, nullptr);

        std::vector<cl_device_id> devices(num_devices);
        dispatch().clGetProgramInfo(program, CL_PROGRAM_DEVICES, num_devices * sizeof(cl_device_id), devices.data(), 0);

        std::vector<size_t> sizes(num_devices);
        dispatch().clGetProgramInfo(program, CL_PROGRAM_BINARY_SIZES, num_devices * sizeof(size_t), sizes.data(), nullptr);

        std::vector<std::vector<unsigned char>> binaries;
        std::vector<unsigned char*> binariesData;
        binaries.reserve(num_devices);
        binariesData.reserve(num_devices);
        for( size_t device = 0; device != num_devices; ++device )
        {
            binaries.emplace_back(sizes[device]);
            binariesData.emplace_back(binaries[device].data());
        }

        error = dispatch().clGetProgramInfo(program, CL_PROGRAM_BINARIES, num_devices * sizeof(unsigned char*), binariesData.data(), nullptr);
        if( error == CL_SUCCESS )
        {
            for (size_t device = 0; device != num_devices; ++device)
            {
                std::ofstream output(dumpDirectory + "DeviceBinary" + std::to_string(device) + ".bin", std::ios::out | std::ios::binary);
                output.write(reinterpret_cast<char const*>(binaries[device].data()), binaries[device].size());
            }
        }
    }
}